

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O0

void __thiscall DBot::Serialize(DBot *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DBot *this_local;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"player",&this->player);
  pFVar1 = FSerializer::operator()(pFVar1,"angle",&this->Angle);
  pFVar1 = FSerializer::operator()(pFVar1,"dest",&this->dest);
  pFVar1 = FSerializer::operator()(pFVar1,"prev",&this->prev);
  pFVar1 = FSerializer::operator()(pFVar1,"enemy",&this->enemy);
  pFVar1 = FSerializer::operator()(pFVar1,"missile",&this->missile);
  pFVar1 = FSerializer::operator()(pFVar1,"mate",&this->mate);
  pFVar1 = FSerializer::operator()(pFVar1,"lastmate",&this->last_mate);
  pFVar1 = FSerializer::operator()(pFVar1,"skill",&this->skill);
  pFVar1 = FSerializer::operator()(pFVar1,"active",&this->t_active);
  pFVar1 = FSerializer::operator()(pFVar1,"respawn",&this->t_respawn);
  pFVar1 = FSerializer::operator()(pFVar1,"strafe",&this->t_strafe);
  pFVar1 = FSerializer::operator()(pFVar1,"react",&this->t_react);
  pFVar1 = FSerializer::operator()(pFVar1,"fight",&this->t_fight);
  pFVar1 = FSerializer::operator()(pFVar1,"roam",&this->t_roam);
  pFVar1 = FSerializer::operator()(pFVar1,"rocket",&this->t_rocket);
  pFVar1 = FSerializer::operator()(pFVar1,"firstshot",&this->first_shot);
  pFVar1 = FSerializer::operator()(pFVar1,"sleft",&this->sleft);
  pFVar1 = FSerializer::operator()(pFVar1,"allround",&this->allround);
  pFVar1 = FSerializer::operator()(pFVar1,"increase",&this->increase);
  FSerializer::operator()(pFVar1,"old",&this->old);
  return;
}

Assistant:

void DBot::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);

	arc("player", player)
		("angle", Angle)
		("dest", dest)
		("prev", prev)
		("enemy", enemy)
		("missile", missile)
		("mate", mate)
		("lastmate", last_mate)
		("skill", skill)
		("active", t_active)
		("respawn", t_respawn)
		("strafe", t_strafe)
		("react", t_react)
		("fight", t_fight)
		("roam", t_roam)
		("rocket", t_rocket)
		("firstshot", first_shot)
		("sleft", sleft)
		("allround", allround)
		("increase", increase)
		("old", old);
}